

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * __thiscall
ON_Font::Internal_DecoratedFont(ON_Font *this,bool bUnderlined,bool bStrikethrough)

{
  ON_Font *pOVar1;
  bool bVar2;
  ON_Font *this_00;
  ON_Font decorated;
  ON_Font local_e0;
  
  if ((bUnderlined || bStrikethrough) &&
     ((((bUnderlined || ((this->m_font_bUnderlined & 1U) != 0)) || (bStrikethrough)) ||
      (this->m_font_bStrikethrough == true)))) {
    this_00 = &local_e0;
    ON_Font(this_00,this);
    if ((local_e0.m_font_bUnderlined != bUnderlined) &&
       (bVar2 = ModificationPermitted
                          (&local_e0,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                           ,0x2ecb), bVar2)) {
      local_e0.m_font_characteristics_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      local_e0.m_font_characteristics_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      local_e0.m_font_characteristics_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      local_e0.m_font_characteristics_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      local_e0.m_font_characteristics_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      local_e0.m_font_characteristics_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      local_e0.m_font_characteristics_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      local_e0.m_font_characteristics_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      local_e0.m_font_characteristics_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      local_e0.m_font_characteristics_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      local_e0.m_font_characteristics_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      local_e0.m_font_characteristics_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      local_e0.m_font_characteristics_hash.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      local_e0.m_font_characteristics_hash.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      local_e0.m_font_characteristics_hash.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      local_e0.m_font_characteristics_hash.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
      local_e0.m_font_characteristics_hash.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      local_e0.m_font_characteristics_hash.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      local_e0.m_font_characteristics_hash.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      local_e0.m_font_characteristics_hash.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
      local_e0.m_font_bUnderlined = bUnderlined;
    }
    if ((local_e0.m_font_bStrikethrough != bStrikethrough) &&
       (bVar2 = ModificationPermitted
                          (&local_e0,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                           ,0x2edc), bVar2)) {
      local_e0.m_font_characteristics_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      local_e0.m_font_characteristics_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      local_e0.m_font_characteristics_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      local_e0.m_font_characteristics_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      local_e0.m_font_characteristics_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      local_e0.m_font_characteristics_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      local_e0.m_font_characteristics_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      local_e0.m_font_characteristics_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      local_e0.m_font_characteristics_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      local_e0.m_font_characteristics_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      local_e0.m_font_characteristics_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      local_e0.m_font_characteristics_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      local_e0.m_font_characteristics_hash.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      local_e0.m_font_characteristics_hash.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      local_e0.m_font_characteristics_hash.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      local_e0.m_font_characteristics_hash.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
      local_e0.m_font_characteristics_hash.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      local_e0.m_font_characteristics_hash.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      local_e0.m_font_characteristics_hash.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      local_e0.m_font_characteristics_hash.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
      local_e0.m_font_bStrikethrough = bStrikethrough;
    }
    if (local_e0.m_runtime_serial_number == 0) {
      this_00 = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,&local_e0,true);
    }
    pOVar1 = this;
    if ((this_00 != (ON_Font *)0x0) && (pOVar1 = this_00, this_00->m_quartet_member == Unset)) {
      this_00->m_quartet_member = this->m_quartet_member;
    }
    this = pOVar1;
    ~ON_Font(&local_e0);
  }
  return this;
}

Assistant:

const ON_Font* ON_Font::Internal_DecoratedFont(
  bool bUnderlined,
  bool bStrikethrough
) const
{
  // Underline and strikethrough are font rendering effects and are not  designed into the font glyphs.
  if (false == bUnderlined && false == bStrikethrough)
    return this;

  if (bUnderlined ? 0 : 1 == this->IsUnderlined() ? 0 : 1 && bStrikethrough ? 0 : 1 == this->IsStrikethrough() ? 0 : 1)
    return this;

  ON_Font decorated(*this);
  decorated.SetUnderlined(bUnderlined);
  decorated.SetStrikethrough(bStrikethrough);
  const ON_Font* decorated_font = decorated.ManagedFont();
  if (nullptr != decorated_font && ON_FontFaceQuartet::Member::Unset == decorated_font->m_quartet_member)
  {
    // Decorated faces are not explicitly in quartets,
    // but when dealing with rich text, we need to know what quartet member they are decorating.
    decorated_font->m_quartet_member = this->m_quartet_member;
  }

  return (nullptr != decorated_font) ? decorated_font : this;
}